

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

LinkClosure * __thiscall cmGeneratorTarget::GetLinkClosure(cmGeneratorTarget *this,string *config)

{
  LinkClosure *this_00;
  bool bVar1;
  int iVar2;
  pointer ppVar3;
  __enable_if_t<is_constructible<value_type,_pair<const_basic_string<char>,_LinkClosure>_&>::value,_pair<iterator,_bool>_>
  _Var4;
  undefined1 local_f0 [8];
  value_type entry;
  LinkClosure lc;
  _Self local_48;
  iterator i;
  string key;
  string *config_local;
  cmGeneratorTarget *this_local;
  
  bVar1 = CanCompileSources(this);
  if (bVar1) {
    cmsys::SystemTools::UpperCase((string *)&i,config);
    local_48._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::LinkClosure,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::LinkClosure>_>_>
         ::find(&this->LinkClosureMap,(string *)&i);
    lc.Languages.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::LinkClosure,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::LinkClosure>_>_>
                  ::end(&this->LinkClosureMap);
    bVar1 = std::operator==(&local_48,
                            (_Self *)&lc.Languages.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (bVar1) {
      this_00 = (LinkClosure *)
                &entry.second.Languages.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      LinkClosure::LinkClosure(this_00);
      ComputeLinkClosure(this,config,this_00);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::LinkClosure>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmGeneratorTarget::LinkClosure_&,_true>
                ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::LinkClosure>
                  *)local_f0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i
                 ,(LinkClosure *)
                  &entry.second.Languages.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
      _Var4 = std::
              map<std::__cxx11::string,cmGeneratorTarget::LinkClosure,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmGeneratorTarget::LinkClosure>>>
              ::insert<std::pair<std::__cxx11::string_const,cmGeneratorTarget::LinkClosure>&>
                        ((map<std::__cxx11::string,cmGeneratorTarget::LinkClosure,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmGeneratorTarget::LinkClosure>>>
                          *)&this->LinkClosureMap,
                         (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::LinkClosure>
                          *)local_f0);
      local_48._M_node = (_Base_ptr)_Var4.first._M_node;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::LinkClosure>
      ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::LinkClosure>
               *)local_f0);
      LinkClosure::~LinkClosure
                ((LinkClosure *)
                 &entry.second.Languages.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::LinkClosure>_>
             ::operator->(&local_48);
    this_local = (cmGeneratorTarget *)&ppVar3->second;
    std::__cxx11::string::~string((string *)&i);
  }
  else {
    if ((GetLinkClosure(std::__cxx11::string_const&)::empty == '\0') &&
       (iVar2 = __cxa_guard_acquire(&GetLinkClosure(std::__cxx11::string_const&)::empty), iVar2 != 0
       )) {
      std::__cxx11::string::string((string *)&GetLinkClosure::empty);
      memset(&GetLinkClosure::empty.Languages,0,0x18);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&GetLinkClosure::empty.Languages);
      __cxa_atexit(LinkClosure::~LinkClosure,&GetLinkClosure::empty,&__dso_handle);
      __cxa_guard_release(&GetLinkClosure(std::__cxx11::string_const&)::empty);
    }
    this_local = (cmGeneratorTarget *)&GetLinkClosure::empty;
  }
  return (LinkClosure *)this_local;
}

Assistant:

cmGeneratorTarget::LinkClosure const* cmGeneratorTarget::GetLinkClosure(
  const std::string& config) const
{
  // There is no link implementation for targets that cannot compile sources.
  if (!this->CanCompileSources()) {
    static LinkClosure const empty = { {}, {} };
    return &empty;
  }

  std::string key(cmSystemTools::UpperCase(config));
  auto i = this->LinkClosureMap.find(key);
  if (i == this->LinkClosureMap.end()) {
    LinkClosure lc;
    this->ComputeLinkClosure(config, lc);
    LinkClosureMapType::value_type entry(key, lc);
    i = this->LinkClosureMap.insert(entry).first;
  }
  return &i->second;
}